

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O3

void __thiscall Assimp::STLExporter::WritePointCloud(STLExporter *this,string *name,aiScene *pScene)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"solid",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," facet normal ",0xe);
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  uVar3 = pScene->mNumMeshes;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      paVar1 = pScene->mMeshes[uVar5];
      if ((paVar1 != (aiMesh *)0x0) && (paVar1->mNumVertices != 0)) {
        lVar7 = 8;
        uVar6 = 0;
        do {
          paVar2 = paVar1->mVertices;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar7 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0xc;
        } while (uVar6 < paVar1->mNumVertices);
        uVar3 = pScene->mNumMeshes;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"endsolid",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  return;
}

Assistant:

void STLExporter::WritePointCloud(const std::string &name, const aiScene* pScene) {
    mOutput << " " << SolidToken << " " << name << endl;
    aiVector3D nor;
    mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh *mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {
            const aiVector3D& v = mesh->mVertices[a];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }
    }
    mOutput << EndSolidToken << " " << name << endl;
}